

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate_decompress.c
# Opt level: O0

_Bool build_litlen_decode_table
                (libdeflate_decompressor *d,uint num_litlen_syms,uint num_offset_syms)

{
  _Bool _Var1;
  uint in_stack_000000a0;
  uint in_stack_000000a4;
  u32 *in_stack_000000a8;
  uint in_stack_000000b4;
  u8 *in_stack_000000b8;
  u32 *in_stack_000000c0;
  u16 *in_stack_00000110;
  uint *in_stack_00000118;
  
  _Var1 = build_decode_table(in_stack_000000c0,in_stack_000000b8,in_stack_000000b4,in_stack_000000a8
                             ,in_stack_000000a4,in_stack_000000a0,in_stack_00000110,
                             in_stack_00000118);
  return _Var1;
}

Assistant:

static bool
build_litlen_decode_table(struct libdeflate_decompressor *d,
			  unsigned num_litlen_syms, unsigned num_offset_syms)
{
	/* When you change TABLEBITS, you must change ENOUGH, and vice versa! */
	STATIC_ASSERT(LITLEN_TABLEBITS == 11 && LITLEN_ENOUGH == 2342);

	STATIC_ASSERT(ARRAY_LEN(litlen_decode_results) ==
		      DEFLATE_NUM_LITLEN_SYMS);

	return build_decode_table(d->u.litlen_decode_table,
				  d->u.l.lens,
				  num_litlen_syms,
				  litlen_decode_results,
				  LITLEN_TABLEBITS,
				  DEFLATE_MAX_LITLEN_CODEWORD_LEN,
				  d->sorted_syms,
				  &d->litlen_tablebits);
}